

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

real __thiscall fasttext::DenseMatrix::dotRow(DenseMatrix *this,Vector *vec,int64_t i)

{
  pointer pfVar1;
  ulong uVar2;
  pointer pfVar3;
  EncounteredNaNError *this_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  undefined1 auVar9 [16];
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x6d,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  if ((this->super_Matrix).m_ <= i) {
    __assert_fail("i < m_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x6e,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  pfVar1 = (vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (this->super_Matrix).n_;
  if ((long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pfVar1 >> 2 != uVar2) {
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x6f,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
    ;
  }
  if ((long)uVar2 < 1) {
    fVar8 = 0.0;
  }
  else {
    uVar4 = i * uVar2;
    pfVar3 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar3 >> 2;
    uVar7 = 0;
    uVar6 = uVar5 - uVar4;
    if (uVar5 < uVar4) {
      uVar6 = uVar7;
    }
    auVar9 = ZEXT816(0);
    do {
      if (uVar6 <= uVar2 - 1) {
        __assert_fail("i * n_ + j < data_.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.h"
                      ,0x30,"const real &fasttext::DenseMatrix::at(int64_t, int64_t) const");
      }
      auVar9 = vfmadd231ss_fma(auVar9,ZEXT416((uint)pfVar3[uVar4 + uVar7]),
                               ZEXT416((uint)pfVar1[uVar7]));
      fVar8 = auVar9._0_4_;
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  if (NAN(fVar8)) {
    this_00 = (EncounteredNaNError *)__cxa_allocate_exception(0x10);
    EncounteredNaNError::EncounteredNaNError(this_00);
    __cxa_throw(this_00,&EncounteredNaNError::typeinfo,std::runtime_error::~runtime_error);
  }
  return fVar8;
}

Assistant:

real DenseMatrix::dotRow(const Vector& vec, int64_t i) const {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  real d = 0.0;
  for (int64_t j = 0; j < n_; j++) {
    d += at(i, j) * vec[j];
  }
  if (std::isnan(d)) {
    throw EncounteredNaNError();
  }
  return d;
}